

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cpp
# Opt level: O1

PSNodesSeq * __thiscall
dg::pta::LLVMPointerGraphBuilder::createAlloc(LLVMPointerGraphBuilder *this,Instruction *Inst)

{
  PSNode *pPVar1;
  DataLayout *DL;
  uint64_t uVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false,_false>,_bool>
  pVar3;
  PSNode *local_30;
  Instruction *local_28;
  
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)1>((PointerGraph *)this);
  local_30 = (PSNode *)0x0;
  if (pPVar1->type == ALLOC) {
    local_30 = pPVar1;
  }
  if ((Inst != (Instruction *)0x0) && (Inst[0x10] == (Instruction)0x3a)) {
    DL = (DataLayout *)llvm::Module::getDataLayout();
    uVar2 = llvmutils::getAllocatedSize((AllocaInst *)Inst,DL);
    (local_30->super_SubgraphNode<dg::pta::PSNode>).size = uVar2;
  }
  local_28 = Inst;
  pVar3 = std::
          _Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<llvm::Value_const*&,dg::pta::PSNode*&>
                    ((_Hashtable<llvm::Value_const*,std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,std::allocator<std::pair<llvm::Value_const*const,dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>>,std::__detail::_Select1st,std::equal_to<llvm::Value_const*>,std::hash<llvm::Value_const*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)(this + 0x188),&local_28,&local_30);
  (local_30->super_SubgraphNode<dg::pta::PSNode>).user_data = local_28;
  return (PSNodesSeq *)
         ((long)pVar3.first.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                ._M_cur.
                super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
         + 0x10);
}

Assistant:

LLVMPointerGraphBuilder::PSNodesSeq &
LLVMPointerGraphBuilder::createAlloc(const llvm::Instruction *Inst) {
    PSNodeAlloc *node = PSNodeAlloc::get(PS.create<PSNodeType::ALLOC>());

    const llvm::AllocaInst *AI = llvm::dyn_cast<llvm::AllocaInst>(Inst);
    if (AI)
        node->setSize(llvmutils::getAllocatedSize(AI, &M->getDataLayout()));

    return addNode(Inst, node);
}